

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O3

string * __thiscall
OpenMPBindClause::toString_abi_cxx11_(string *__return_storage_ptr__,OpenMPBindClause *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string parameter_string;
  long *local_68 [2];
  long local_58 [2];
  undefined1 *local_48;
  long local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"bind (","");
  local_40 = 0;
  local_38 = 0;
  local_48 = &local_38;
  if ((ulong)this->bind_binding < 3) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_48,0,(char *)0x0,
               (ulong)(&DAT_001a7354 + *(int *)(&DAT_001a7354 + (ulong)this->bind_binding * 4)));
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"The parameter of bind clause is not supported.\n",0x2f);
  }
  if (local_40 == 0) {
    std::__cxx11::string::substr((ulong)local_68,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_68);
    if (local_68[0] == local_58) goto LAB_0017e57a;
  }
  else {
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char*>((string *)local_68,local_48,local_48 + local_40);
    std::__cxx11::string::append((char *)local_68);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_68[0]);
    if (local_68[0] == local_58) goto LAB_0017e57a;
  }
  operator_delete(local_68[0],local_58[0] + 1);
LAB_0017e57a:
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPBindClause::toString() {

    std::string result = "bind (";
    std::string parameter_string;
    OpenMPBindClauseBinding bind_binding = this->getBindClauseBinding();
    switch (bind_binding) {
        case OMPC_BIND_teams:
            parameter_string = "teams";
            break;
        case OMPC_BIND_parallel:
            parameter_string = "parallel";
            break;
        case OMPC_BIND_thread:
            parameter_string = "thread";
            break;
        default:
            std::cout << "The parameter of bind clause is not supported.\n";
    };

    if (parameter_string.size() > 0) {
        result += parameter_string + ") ";
    }
    else {
        result = result.substr(0, result.size()-2);
    }

    return result;
}